

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereIsCoveringIndexWalkCallback(Walker *pWalk,Expr *pExpr)

{
  int iTab;
  CoveringIndexCheck *pCVar1;
  Index *pIVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  pCVar1 = (pWalk->u).pCovIdxCk;
  pIVar2 = pCVar1->pIdx;
  if ((pExpr->op | 2) == 0xaa) {
    if (pExpr->iTable == pCVar1->iTabCur) {
      if ((ulong)pIVar2->nColumn != 0) {
        uVar4 = 0;
        do {
          if (pIVar2->aiColumn[uVar4] == pExpr->iColumn) {
            return 0;
          }
          uVar4 = uVar4 + 1;
        } while (pIVar2->nColumn != uVar4);
      }
      pCVar1->bUnidx = '\x01';
      return 2;
    }
  }
  else {
    if ((pIVar2->field_0x64 & 0x10) == 0) {
      return 0;
    }
    if (pIVar2->nColumn == 0) {
      return 0;
    }
    iTab = pCVar1->iTabCur;
    lVar5 = 4;
    uVar4 = 0;
    do {
      if ((pIVar2->aiColumn[uVar4] == -2) &&
         (iVar3 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                     *(Expr **)((long)pIVar2->aColExpr->a + lVar5 * 2 + -8),iTab),
         iVar3 == 0)) {
        pCVar1->bExpr = '\x01';
        return 1;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0xc;
    } while (uVar4 < pIVar2->nColumn);
  }
  return 0;
}

Assistant:

static int whereIsCoveringIndexWalkCallback(Walker *pWalk, Expr *pExpr){
  int i;                    /* Loop counter */
  const Index *pIdx;        /* The index of interest */
  const i16 *aiColumn;      /* Columns contained in the index */
  u16 nColumn;              /* Number of columns in the index */
  CoveringIndexCheck *pCk;  /* Info about this search */

  pCk = pWalk->u.pCovIdxCk;
  pIdx = pCk->pIdx;
  if( (pExpr->op==TK_COLUMN || pExpr->op==TK_AGG_COLUMN) ){
    /* if( pExpr->iColumn<(BMS-1) && pIdx->bHasExpr==0 ) return WRC_Continue;*/
    if( pExpr->iTable!=pCk->iTabCur ) return WRC_Continue;
    pIdx = pWalk->u.pCovIdxCk->pIdx;
    aiColumn = pIdx->aiColumn;
    nColumn = pIdx->nColumn;
    for(i=0; i<nColumn; i++){
      if( aiColumn[i]==pExpr->iColumn ) return WRC_Continue;
    }
    pCk->bUnidx = 1;
    return WRC_Abort;
  }else if( pIdx->bHasExpr
         && exprIsCoveredByIndex(pExpr, pIdx, pWalk->u.pCovIdxCk->iTabCur) ){
    pCk->bExpr = 1;
    return WRC_Prune;
  }
  return WRC_Continue;
}